

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>::AddMapping
          (ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> *this,char *name,eCh_GlyphType enumid)

{
  ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType> mpair;
  ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType> CStack_38;
  
  ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>::ChEnumNamePair(&CStack_38,name,enumid);
  std::
  vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>
  ::push_back((this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&CStack_38);
  std::__cxx11::string::~string((string *)&CStack_38);
  return;
}

Assistant:

void AddMapping(const char* name, Te enumid) {
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }